

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

void __thiscall
VulkanHppGenerator::appendRAIIDispatcherCommands
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedCommands,string *title,string *contextInitializers,string *contextMembers,
          string *deviceAssignments,string *deviceMembers,string *instanceAssignments,
          string *instanceMembers)

{
  _Base_ptr __rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  string *title_00;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pRVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer __v;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  _Base_ptr *this_00;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  string ia;
  string da;
  string imp;
  string im;
  string dmp;
  string dm;
  string cm;
  string ci;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  VulkanHppGenerator *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  string *local_68;
  string *local_60;
  pointer local_58;
  pointer local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
  *local_48;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_40;
  pointer local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  pRVar7 = (requireData->
           super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (requireData->
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_198 = this;
  local_70 = contextMembers;
  local_68 = contextInitializers;
  local_60 = title;
  local_40 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)listedCommands;
  if (pRVar7 != local_58) {
    local_48 = &this->m_commands;
    paVar1 = &local_238.field_2;
    do {
      __v = (pRVar7->commands).
            super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (pRVar7->commands).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = pRVar7;
      if (__v != local_38) {
        do {
          pVar12 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>(local_40,&__v->name);
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar5 = anon_unknown.dwarf_18c225::findByNameOrAlias<VulkanHppGenerator::CommandData>
                              (local_48,&__v->name);
            if (cVar5._M_node[4]._M_left == (_Base_ptr)0x0) {
              std::operator+(&local_190,", ",&__v->name);
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_190,"( PFN_");
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if (paVar9 == paVar8) {
                local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_1b8._M_dataplus._M_p = (pointer)paVar9;
              }
              local_1b8._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_1b8,(__v->name)._M_dataplus._M_p,
                                  (__v->name)._M_string_length);
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if (paVar9 == paVar8) {
                local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_1d8._M_dataplus._M_p = (pointer)paVar9;
              }
              local_1d8._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_1d8,"( getProcAddr( NULL, \"");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if (paVar9 == paVar8) {
                local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_1f8._M_dataplus._M_p = (pointer)paVar9;
              }
              local_1f8._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_1f8,(__v->name)._M_dataplus._M_p,
                                  (__v->name)._M_string_length);
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if (paVar9 == paVar8) {
                local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_218._M_dataplus._M_p = (pointer)paVar9;
              }
              local_218._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_218,"\" ) ) )");
              local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
              paVar9 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p == paVar9) {
                local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                local_238._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_238._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_90,local_238._M_dataplus._M_p,local_238._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != paVar1) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                local_1b8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_1d8,"      PFN_",&__v->name);
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_1d8," ");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if (paVar9 == paVar8) {
                local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_1f8._M_dataplus._M_p = (pointer)paVar9;
              }
              local_1f8._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_1f8,(__v->name)._M_dataplus._M_p,
                                  (__v->name)._M_string_length);
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if (paVar9 == paVar8) {
                local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_218._M_dataplus._M_p = (pointer)paVar9;
              }
              local_218._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_218," = 0;\n");
              local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
              paVar9 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p == paVar9) {
                local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                local_238._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_238._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_b0,local_238._M_dataplus._M_p,local_238._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != paVar1) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              uVar10 = local_1d8.field_2._M_allocated_capacity;
              _Var11._M_p = local_1d8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_001302c4;
            }
            else {
              __rhs = cVar5._M_node + 1;
              this_00 = &cVar5._M_node[4]._M_parent;
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_00,"VkDevice");
              if (iVar4 == 0) {
LAB_0012eed0:
                std::operator+(&local_190,"        ",&__v->name);
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_190," = PFN_");
                local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if (paVar9 == paVar8) {
                  local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                }
                else {
                  local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1b8._M_dataplus._M_p = (pointer)paVar9;
                }
                local_1b8._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_1b8,(__v->name)._M_dataplus._M_p,
                                   (__v->name)._M_string_length);
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if (paVar9 == paVar8) {
                  local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                }
                else {
                  local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1d8._M_dataplus._M_p = (pointer)paVar9;
                }
                local_1d8._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_1d8,"( vkGetDeviceProcAddr( device, \"");
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if (paVar9 == paVar8) {
                  local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                }
                else {
                  local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1f8._M_dataplus._M_p = (pointer)paVar9;
                }
                local_1f8._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_1f8,(__v->name)._M_dataplus._M_p,
                                   (__v->name)._M_string_length);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if (paVar9 == paVar8) {
                  local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                }
                else {
                  local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_218._M_dataplus._M_p = (pointer)paVar9;
                }
                local_218._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_218,"\" ) );\n");
                local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                paVar9 = &pbVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == paVar9) {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  local_238._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                }
                local_238._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_150,local_238._M_dataplus._M_p,local_238._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != paVar1) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                  operator_delete(local_1b8._M_dataplus._M_p,
                                  local_1b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190._M_dataplus._M_p != &local_190.field_2) {
                  operator_delete(local_190._M_dataplus._M_p,
                                  local_190.field_2._M_allocated_capacity + 1);
                }
                p_Var2 = (_Base_ptr)(__v->name)._M_string_length;
                if ((p_Var2 != cVar5._M_node[1]._M_parent) ||
                   ((p_Var2 != (_Base_ptr)0x0 &&
                    (iVar4 = bcmp((__v->name)._M_dataplus._M_p,*(void **)__rhs,(size_t)p_Var2),
                    iVar4 != 0)))) {
                  std::operator+(&local_190,"        if ( !",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_190," ) ");
                  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar6->_M_dataplus)._M_p;
                  paVar8 = &pbVar6->field_2;
                  if (paVar9 == paVar8) {
                    local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  }
                  else {
                    local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1b8._M_dataplus._M_p = (pointer)paVar9;
                  }
                  local_1b8._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_1b8,*(char **)(cVar5._M_node + 1),
                                     (size_type)cVar5._M_node[1]._M_parent);
                  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar6->_M_dataplus)._M_p;
                  paVar8 = &pbVar6->field_2;
                  if (paVar9 == paVar8) {
                    local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  }
                  else {
                    local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1d8._M_dataplus._M_p = (pointer)paVar9;
                  }
                  local_1d8._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_1d8," = ");
                  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar6->_M_dataplus)._M_p;
                  paVar8 = &pbVar6->field_2;
                  if (paVar9 == paVar8) {
                    local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  }
                  else {
                    local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1f8._M_dataplus._M_p = (pointer)paVar9;
                  }
                  local_1f8._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_1f8,(__v->name)._M_dataplus._M_p,
                                     (__v->name)._M_string_length);
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar6->_M_dataplus)._M_p;
                  paVar8 = &pbVar6->field_2;
                  if (paVar9 == paVar8) {
                    local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  }
                  else {
                    local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_218._M_dataplus._M_p = (pointer)paVar9;
                  }
                  local_218._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_218,";\n");
                  local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                  paVar9 = &pbVar6->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p == paVar9) {
                    local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    local_238._M_dataplus._M_p = (pointer)paVar1;
                  }
                  else {
                    local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  }
                  local_238._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_150,local_238._M_dataplus._M_p,local_238._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p != paVar1) {
                    operator_delete(local_238._M_dataplus._M_p,
                                    local_238.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != &local_218.field_2) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    local_1d8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                    operator_delete(local_1b8._M_dataplus._M_p,
                                    local_1b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p,
                                    local_190.field_2._M_allocated_capacity + 1);
                  }
                }
                std::operator+(&local_1d8,"      PFN_",&__v->name);
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_1d8," ");
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if (paVar9 == paVar8) {
                  local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                }
                else {
                  local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1f8._M_dataplus._M_p = (pointer)paVar9;
                }
                local_1f8._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_1f8,(__v->name)._M_dataplus._M_p,
                                   (__v->name)._M_string_length);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if (paVar9 == paVar8) {
                  local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                }
                else {
                  local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_218._M_dataplus._M_p = (pointer)paVar9;
                }
                local_218._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_218," = 0;\n");
                local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                paVar9 = &pbVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == paVar9) {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  local_238._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                }
                local_238._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_d0,local_238._M_dataplus._M_p,local_238._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != paVar1) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_218,"      PFN_dummy ",&__v->name);
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_218,"_placeholder = 0;\n");
                local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                paVar9 = &pbVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == paVar9) {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  local_238._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                }
                local_238._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_f0,local_238._M_dataplus._M_p,local_238._M_string_length);
              }
              else {
                local_238._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"VkDevice","");
                bVar3 = hasParentHandle(local_198,(string *)this_00,&local_238);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != paVar1) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
                if (bVar3) goto LAB_0012eed0;
                iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)this_00,"VkInstance");
                if (iVar4 != 0) {
                  local_238._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_238,"VkInstance","");
                  bVar3 = hasParentHandle(local_198,(string *)this_00,&local_238);
                  if (!bVar3) {
                    __assert_fail("( commandIt->second.handle == \"VkInstance\" ) || hasParentHandle( commandIt->second.handle, \"VkInstance\" )"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                  ,0x2f8,
                                  "void VulkanHppGenerator::appendRAIIDispatcherCommands(const std::vector<RequireData> &, std::set<std::string> &, const std::string &, std::string &, std::string &, std::string &, std::string &, std::string &, std::string &) const"
                                 );
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p != paVar1) {
                    operator_delete(local_238._M_dataplus._M_p,
                                    local_238.field_2._M_allocated_capacity + 1);
                  }
                }
                iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&__v->name,"vkGetInstanceProcAddr");
                if (iVar4 != 0) {
                  std::operator+(&local_190,"        ",&__v->name);
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_190," = PFN_");
                  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar6->_M_dataplus)._M_p;
                  paVar8 = &pbVar6->field_2;
                  if (paVar9 == paVar8) {
                    local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  }
                  else {
                    local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1b8._M_dataplus._M_p = (pointer)paVar9;
                  }
                  local_1b8._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_1b8,(__v->name)._M_dataplus._M_p,
                                     (__v->name)._M_string_length);
                  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar6->_M_dataplus)._M_p;
                  paVar8 = &pbVar6->field_2;
                  if (paVar9 == paVar8) {
                    local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  }
                  else {
                    local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1d8._M_dataplus._M_p = (pointer)paVar9;
                  }
                  local_1d8._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_1d8,"( vkGetInstanceProcAddr( instance, \"");
                  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar6->_M_dataplus)._M_p;
                  paVar8 = &pbVar6->field_2;
                  if (paVar9 == paVar8) {
                    local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  }
                  else {
                    local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1f8._M_dataplus._M_p = (pointer)paVar9;
                  }
                  local_1f8._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_1f8,(__v->name)._M_dataplus._M_p,
                                     (__v->name)._M_string_length);
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar6->_M_dataplus)._M_p;
                  paVar8 = &pbVar6->field_2;
                  if (paVar9 == paVar8) {
                    local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  }
                  else {
                    local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_218._M_dataplus._M_p = (pointer)paVar9;
                  }
                  local_218._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_218,"\" ) );\n");
                  local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                  paVar9 = &pbVar6->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p == paVar9) {
                    local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    local_238._M_dataplus._M_p = (pointer)paVar1;
                  }
                  else {
                    local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  }
                  local_238._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_170,local_238._M_dataplus._M_p,local_238._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p != paVar1) {
                    operator_delete(local_238._M_dataplus._M_p,
                                    local_238.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != &local_218.field_2) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    local_1d8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                    operator_delete(local_1b8._M_dataplus._M_p,
                                    local_1b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p,
                                    local_190.field_2._M_allocated_capacity + 1);
                  }
                  p_Var2 = (_Base_ptr)(__v->name)._M_string_length;
                  if ((p_Var2 != cVar5._M_node[1]._M_parent) ||
                     ((p_Var2 != (_Base_ptr)0x0 &&
                      (iVar4 = bcmp((__v->name)._M_dataplus._M_p,*(void **)__rhs,(size_t)p_Var2),
                      iVar4 != 0)))) {
                    std::operator+(&local_190,"        if ( !",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs);
                    pbVar6 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             append(&local_190," ) ");
                    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(pbVar6->_M_dataplus)._M_p;
                    paVar8 = &pbVar6->field_2;
                    if (paVar9 == paVar8) {
                      local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    }
                    else {
                      local_1b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_1b8._M_dataplus._M_p = (pointer)paVar9;
                    }
                    local_1b8._M_string_length = pbVar6->_M_string_length;
                    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                    pbVar6->_M_string_length = 0;
                    (pbVar6->field_2)._M_local_buf[0] = '\0';
                    pbVar6 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             _M_append(&local_1b8,*(char **)(cVar5._M_node + 1),
                                       (size_type)cVar5._M_node[1]._M_parent);
                    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(pbVar6->_M_dataplus)._M_p;
                    paVar8 = &pbVar6->field_2;
                    if (paVar9 == paVar8) {
                      local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    }
                    else {
                      local_1d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_1d8._M_dataplus._M_p = (pointer)paVar9;
                    }
                    local_1d8._M_string_length = pbVar6->_M_string_length;
                    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                    pbVar6->_M_string_length = 0;
                    (pbVar6->field_2)._M_local_buf[0] = '\0';
                    pbVar6 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             append(&local_1d8," = ");
                    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(pbVar6->_M_dataplus)._M_p;
                    paVar8 = &pbVar6->field_2;
                    if (paVar9 == paVar8) {
                      local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    }
                    else {
                      local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_1f8._M_dataplus._M_p = (pointer)paVar9;
                    }
                    local_1f8._M_string_length = pbVar6->_M_string_length;
                    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                    pbVar6->_M_string_length = 0;
                    (pbVar6->field_2)._M_local_buf[0] = '\0';
                    pbVar6 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             _M_append(&local_1f8,(__v->name)._M_dataplus._M_p,
                                       (__v->name)._M_string_length);
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(pbVar6->_M_dataplus)._M_p;
                    paVar8 = &pbVar6->field_2;
                    if (paVar9 == paVar8) {
                      local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    }
                    else {
                      local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_218._M_dataplus._M_p = (pointer)paVar9;
                    }
                    local_218._M_string_length = pbVar6->_M_string_length;
                    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                    pbVar6->_M_string_length = 0;
                    (pbVar6->field_2)._M_local_buf[0] = '\0';
                    pbVar6 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             append(&local_218,";\n");
                    local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                    paVar9 = &pbVar6->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p == paVar9) {
                      local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                      local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                      local_238._M_dataplus._M_p = (pointer)paVar1;
                    }
                    else {
                      local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    }
                    local_238._M_string_length = pbVar6->_M_string_length;
                    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
                    pbVar6->_M_string_length = 0;
                    (pbVar6->field_2)._M_local_buf[0] = '\0';
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_170,local_238._M_dataplus._M_p,local_238._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != paVar1) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      local_238.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_218._M_dataplus._M_p != &local_218.field_2) {
                      operator_delete(local_218._M_dataplus._M_p,
                                      local_218.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                      operator_delete(local_1f8._M_dataplus._M_p,
                                      local_1f8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                      operator_delete(local_1d8._M_dataplus._M_p,
                                      local_1d8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                      operator_delete(local_1b8._M_dataplus._M_p,
                                      local_1b8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_190._M_dataplus._M_p != &local_190.field_2) {
                      operator_delete(local_190._M_dataplus._M_p,
                                      local_190.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                std::operator+(&local_1d8,"      PFN_",&__v->name);
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_1d8," ");
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if (paVar9 == paVar8) {
                  local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                }
                else {
                  local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1f8._M_dataplus._M_p = (pointer)paVar9;
                }
                local_1f8._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_1f8,(__v->name)._M_dataplus._M_p,
                                   (__v->name)._M_string_length);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if (paVar9 == paVar8) {
                  local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                }
                else {
                  local_218.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_218._M_dataplus._M_p = (pointer)paVar9;
                }
                local_218._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_218," = 0;\n");
                local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                paVar9 = &pbVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == paVar9) {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  local_238._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                }
                local_238._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_110,local_238._M_dataplus._M_p,local_238._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != paVar1) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_218,"      PFN_dummy ",&__v->name);
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_218,"_placeholder = 0;\n");
                local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                paVar9 = &pbVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == paVar9) {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  local_238._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_238.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                }
                local_238._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_130,local_238._M_dataplus._M_p,local_238._M_string_length);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != paVar1) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              uVar10 = local_218.field_2._M_allocated_capacity;
              _Var11._M_p = local_218._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_001302c4;
            }
            operator_delete(_Var11._M_p,uVar10 + 1);
          }
LAB_001302c4:
          __v = __v + 1;
        } while (__v != local_38);
      }
      pRVar7 = local_50 + 1;
    } while (pRVar7 != local_58);
  }
  title_00 = local_60;
  paVar1 = &local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_allocated_capacity =
       local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  addTitleAndProtection(&local_238,local_198,local_60,&local_90,&local_218);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (local_68,local_238._M_dataplus._M_p,local_238._M_string_length);
  paVar9 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar9) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218._M_string_length = 0;
  local_218.field_2._M_allocated_capacity =
       local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  addTitleAndProtection(&local_238,local_198,title_00,&local_b0,&local_218);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (local_70,local_238._M_dataplus._M_p,local_238._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar9) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218._M_string_length = 0;
  local_218.field_2._M_allocated_capacity =
       local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  addTitleAndProtection(&local_238,local_198,title_00,&local_150,&local_218);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (deviceAssignments,local_238._M_dataplus._M_p,local_238._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar9) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  addTitleAndProtection(&local_238,local_198,title_00,&local_d0,&local_f0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (deviceMembers,local_238._M_dataplus._M_p,local_238._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar9) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_218._M_string_length = 0;
  local_218.field_2._M_allocated_capacity =
       local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  addTitleAndProtection(&local_238,local_198,title_00,&local_170,&local_218);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (instanceAssignments,local_238._M_dataplus._M_p,local_238._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar9) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  addTitleAndProtection(&local_238,local_198,title_00,&local_110,&local_130);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (instanceMembers,local_238._M_dataplus._M_p,local_238._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar9) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void VulkanHppGenerator::appendRAIIDispatcherCommands( std::vector<RequireData> const & requireData,
                                                       std::set<std::string> &          listedCommands,
                                                       std::string const &              title,
                                                       std::string &                    contextInitializers,
                                                       std::string &                    contextMembers,
                                                       std::string &                    deviceAssignments,
                                                       std::string &                    deviceMembers,
                                                       std::string &                    instanceAssignments,
                                                       std::string &                    instanceMembers ) const
{
  std::string ci, cm, da, dm, dmp, ia, im, imp;
  for ( auto const & require : requireData )
  {
    for ( auto const & command : require.commands )
    {
      if ( listedCommands.insert( command.name ).second )
      {
        auto commandIt = findByNameOrAlias( m_commands, command.name );
        if ( commandIt->second.handle.empty() )
        {
          ci += ", " + command.name + "( PFN_" + command.name + "( getProcAddr( NULL, \"" + command.name + "\" ) ) )";

          cm += "      PFN_" + command.name + " " + command.name + " = 0;\n";
        }
        else if ( ( commandIt->second.handle == "VkDevice" ) || hasParentHandle( commandIt->second.handle, "VkDevice" ) )
        {
          da += "        " + command.name + " = PFN_" + command.name + "( vkGetDeviceProcAddr( device, \"" + command.name + "\" ) );\n";
          // if this is an alias'ed function, use it as a fallback for the original one
          if ( command.name != commandIt->first )
          {
            da += "        if ( !" + commandIt->first + " ) " + commandIt->first + " = " + command.name + ";\n";
          }

          dm += "      PFN_" + command.name + " " + command.name + " = 0;\n";
          dmp += "      PFN_dummy " + command.name + "_placeholder = 0;\n";
        }
        else
        {
          assert( ( commandIt->second.handle == "VkInstance" ) || hasParentHandle( commandIt->second.handle, "VkInstance" ) );

          // filter out vkGetInstanceProcAddr, as starting with Vulkan 1.2 it can resolve itself only (!) with an
          // instance nullptr !
          if ( command.name != "vkGetInstanceProcAddr" )
          {
            ia += "        " + command.name + " = PFN_" + command.name + "( vkGetInstanceProcAddr( instance, \"" + command.name + "\" ) );\n";
            // if this is an alias'ed function, use it as a fallback for the original one
            if ( command.name != commandIt->first )
            {
              ia += "        if ( !" + commandIt->first + " ) " + commandIt->first + " = " + command.name + ";\n";
            }
          }

          im += +"      PFN_" + command.name + " " + command.name + " = 0;\n";
          imp += "      PFN_dummy " + command.name + "_placeholder = 0;\n";
        }
      }
    }
  }
  contextInitializers += addTitleAndProtection( title, ci );
  contextMembers += addTitleAndProtection( title, cm );
  deviceAssignments += addTitleAndProtection( title, da );
  deviceMembers += addTitleAndProtection( title, dm, dmp );
  instanceAssignments += addTitleAndProtection( title, ia );
  instanceMembers += addTitleAndProtection( title, im, imp );
}